

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaoSolver.cpp
# Opt level: O0

int __thiscall BaoSolver::check(BaoSolver *this,uint32_t s,int k)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  int local_58;
  int local_54;
  int j;
  int i_1;
  int ret;
  value_type local_40 [2];
  int i;
  vector<int,_std::allocator<int>_> vec;
  int k_local;
  uint32_t s_local;
  BaoSolver *this_local;
  
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = k;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = s;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&i);
  if (vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == 0) {
    this_local._4_4_ = -1;
  }
  else {
    for (local_40[0] = 0; local_40[0] < this->n; local_40[0] = local_40[0] + 1) {
      if ((vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ >> ((byte)local_40[0] & 0x1f) & 1) != 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&i,local_40);
      }
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,0);
    bVar2 = checkIfConnect(this,*pvVar3,
                           vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_);
    if (bVar2) {
      j = 0;
      for (local_54 = 0;
          sVar4 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&i), local_58 = local_54,
          (ulong)(long)local_54 < sVar4; local_54 = local_54 + 1) {
        while( true ) {
          local_58 = local_58 + 1;
          sVar4 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&i);
          if (sVar4 <= (ulong)(long)local_58) break;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&i,(long)local_54);
          iVar1 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&i,(long)local_58);
          j = (1 - this->edge[iVar1][*pvVar3]) + j;
        }
      }
      if ((int)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage < j) {
        this_local._4_4_ = -1;
      }
      else {
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&i);
        this_local._4_4_ = (int)sVar4;
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  local_40[1] = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  return this_local._4_4_;
}

Assistant:

int BaoSolver::check(uint32_t s, int k) {
	vector <int> vec; vec.clear();
    if (s == 0) return -1;
	for (int i = 0; i < n; i++) if ((s >> i) & 1) vec.push_back(i);
    if (!checkIfConnect(vec[0], s)) return -1;
	int ret = 0;
	for (int i = 0; i < vec.size(); i++)
		for (int j = i + 1; j < vec.size(); j++) {
			ret += 1 - edge[vec[i]][vec[j]];
		}
	if (ret > k) return -1;
	else return vec.size();
}